

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O3

Vec_Int_t * Wlc_NtkGetPut(Abc_Ntk_t *pNtk,Gia_Man_t *pGia)

{
  int Entry;
  long *plVar1;
  Abc_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  Abc_Nam_t *p_00;
  char *pcVar6;
  size_t sVar7;
  Vec_Int_t *p_01;
  char cVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  int local_44;
  
  if (pNtk->vPos->nSize == 1) {
    if (pNtk->nObjCounts[7] == 1) {
      if (pNtk->vCos->nSize < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Entry = pGia->nRegs;
      plVar1 = (long *)*pNtk->vCos->pArray;
      plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      pcVar17 = (char *)plVar1[7];
      iVar3 = *(int *)((long)plVar1 + 0x1c);
      p = (Vec_Int_t *)malloc(0x10);
      iVar4 = 0x10;
      if (0xe < iVar3 - 1U) {
        iVar4 = iVar3;
      }
      p->nSize = 0;
      p->nCap = iVar4;
      if (iVar4 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc((long)iVar4 << 2);
      }
      p->pArray = piVar5;
      if (pGia->vNamesIn == (Vec_Ptr_t *)0x0) {
        p_00 = (Abc_Nam_t *)0x0;
      }
      else {
        p_00 = Abc_NamStart(100,0x10);
        uVar14 = 0;
        while ((long)uVar14 < (long)pGia->vNamesIn->nSize) {
          uVar2 = Abc_NamStrFindOrAdd(p_00,(char *)pGia->vNamesIn->pArray[uVar14],(int *)0x0);
          uVar14 = uVar14 + 1;
          if (uVar14 != uVar2) {
            __assert_fail("Value == i+1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                          ,0x106,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
          }
        }
        iVar3 = *(int *)((long)plVar1 + 0x1c);
      }
      if (0 < iVar3) {
        uVar14 = 0;
        local_44 = 0;
        do {
          pObj = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                  (long)*(int *)(plVar1[4] + uVar14 * 4) * 8);
          uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
          if ((uVar2 != 2) && (uVar2 != 5)) {
            __assert_fail("Abc_ObjIsCi(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                          ,0x10d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
          }
          pcVar6 = Abc_ObjName(pObj);
          if (p_00 == (Abc_Nam_t *)0x0) {
            sVar7 = strlen(pcVar6);
            uVar2 = (uint)sVar7;
            uVar16 = sVar7 & 0xffffffff;
            uVar9 = (int)uVar2 >> 0x1f & uVar2;
            uVar13 = sVar7 & 0xffffffff;
            do {
              uVar16 = uVar16 - 1;
              uVar11 = (uint)uVar13;
              uVar12 = uVar9 - 1;
              uVar10 = uVar9;
              if ((int)uVar11 < 1) break;
              uVar12 = uVar11 - 1;
              uVar13 = (ulong)uVar12;
              uVar10 = uVar11;
            } while (0xf5 < (byte)(pcVar6[uVar16 & 0xffffffff] - 0x3aU));
            if (uVar10 == uVar2) goto LAB_008ab92a;
            iVar3 = atoi(pcVar6 + (long)(int)uVar12 + 1);
          }
          else {
            iVar3 = Abc_NamStrFind(p_00,pcVar6);
            iVar3 = iVar3 + pGia->nRegs + ~pGia->vCis->nSize;
            if (iVar3 < 0) {
LAB_008ab92a:
              iVar3 = (int)uVar14;
              if (local_44 == 0) {
                printf("Cannot read input name \"%s\" of fanin %d.\n",pcVar6,uVar14 & 0xffffffff);
                local_44 = 1;
              }
              else {
                local_44 = local_44 + 1;
              }
            }
          }
          Vec_IntPush(p,iVar3);
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)*(int *)((long)plVar1 + 0x1c));
        if (local_44 != 0) {
          printf("Cannot read names for %d inputs of the invariant.\n");
        }
      }
      if (p_00 != (Abc_Nam_t *)0x0) {
        Abc_NamStop(p_00);
      }
      iVar3 = p->nSize;
      if (iVar3 != *(int *)((long)plVar1 + 0x1c)) {
        __assert_fail("Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                      ,0x12d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
      }
      p_01 = (Vec_Int_t *)malloc(0x10);
      p_01->nCap = 1000;
      p_01->nSize = 0;
      piVar5 = (int *)malloc(4000);
      p_01->pArray = piVar5;
      iVar4 = Abc_SopGetCubeNum(pcVar17);
      Vec_IntPush(p_01,iVar4);
LAB_008ab9e9:
      cVar8 = *pcVar17;
      if (cVar8 == '\0') {
        Vec_IntPush(p_01,Entry);
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
        }
        free(p);
        return p_01;
      }
      iVar4 = 0;
      pcVar6 = pcVar17;
      do {
        pcVar6 = pcVar6 + 1;
        if (cVar8 != '-') {
          if ((cVar8 == '\0') || (cVar8 == ' ')) goto LAB_008aba10;
          iVar4 = iVar4 + 1;
        }
        cVar8 = *pcVar6;
      } while( true );
    }
    pcVar17 = "The number of internal nodes is other than 1.";
  }
  else {
    pcVar17 = "The number of outputs is other than 1.";
  }
  puts(pcVar17);
  return (Vec_Int_t *)0x0;
LAB_008aba10:
  Vec_IntPush(p_01,iVar4);
  lVar15 = 0;
  do {
    cVar8 = pcVar17[lVar15];
    if (cVar8 != '-') {
      if ((cVar8 == '\0') || (cVar8 == ' ')) break;
      if (iVar3 <= lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pArray[lVar15] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_01,(uint)(cVar8 == '0') + p->pArray[lVar15] * 2);
    }
    lVar15 = lVar15 + 1;
  } while( true );
  pcVar17 = pcVar17 + (long)*(int *)((long)plVar1 + 0x1c) + 3;
  goto LAB_008ab9e9;
}

Assistant:

Vec_Int_t * Wlc_NtkGetPut( Abc_Ntk_t * pNtk, Gia_Man_t * pGia )
{
    int nRegs = Gia_ManRegNum(pGia);
    Vec_Int_t * vRes = NULL;
    if ( Abc_NtkPoNum(pNtk) != 1 )
        printf( "The number of outputs is other than 1.\n" );
    else if ( Abc_NtkNodeNum(pNtk) != 1 )
        printf( "The number of internal nodes is other than 1.\n" );
    else
    {
        Abc_Nam_t * pNames = NULL;
        Abc_Obj_t * pFanin, * pNode = Abc_ObjFanin0( Abc_NtkCo(pNtk, 0) );
        char * pName, * pCube, * pSop = (char *)pNode->pData;
        Vec_Int_t * vFanins = Vec_IntAlloc( Abc_ObjFaninNum(pNode) );
        int i, k, Value, nLits, Counter = 0;
        if ( pGia->vNamesIn )
        {
            // hash the names
            pNames = Abc_NamStart( 100, 16 );
            Vec_PtrForEachEntry( char *, pGia->vNamesIn, pName, i )
            {
                Value = Abc_NamStrFindOrAdd( pNames, pName, NULL );
                assert( Value == i+1 );
                //printf( "%s(%d) ", pName, i );
            }
            //printf( "\n" );
        }
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            assert( Abc_ObjIsCi(pFanin) );
            pName = Abc_ObjName(pFanin);
            if ( pNames )
            {
                Value = Abc_NamStrFind(pNames, pName) - 1 - Gia_ManPiNum(pGia);
                if ( Value < 0 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
            }
            else
            {
                for ( k = (int)strlen(pName)-1; k >= 0; k-- )
                    if ( pName[k] < '0' || pName[k] > '9' )
                        break;
                if ( k == (int)strlen(pName)-1 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
                else 
                    Value = atoi(pName + k + 1);
            }
            Vec_IntPush( vFanins, Value );
        }
        if ( Counter )
            printf( "Cannot read names for %d inputs of the invariant.\n", Counter );
        if ( pNames )
            Abc_NamStop( pNames );
        assert( Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode) );
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, Abc_SopGetCubeNum(pSop) );
        Abc_SopForEachCube( pSop, Abc_ObjFaninNum(pNode), pCube )
        {
            nLits = 0;
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    Vec_IntPush( vRes, Abc_Var2Lit(Vec_IntEntry(vFanins, k), (int)Value == '0') );
        }
        Vec_IntPush( vRes, nRegs );
        Vec_IntFree( vFanins );
    }
    return vRes;
}